

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::Configure(cmGlobalGenerator *this)

{
  cmTargets *this_00;
  cmake *pcVar1;
  pointer ppcVar2;
  bool bVar3;
  char *pcVar4;
  cmMakefile *pcVar5;
  mapped_type *pmVar6;
  ostream *poVar7;
  uint uVar8;
  __node_base *p_Var9;
  char **log;
  undefined **ppuVar10;
  allocator local_291;
  cmMakefile *dirMf;
  string f;
  Snapshot snapshot;
  cmTargets globalTargets;
  char num [100];
  ostringstream msg;
  
  this->FirstTimeProgress = 0.0;
  ClearGeneratorMembers(this);
  pcVar1 = this->CMakeInstance;
  snapshot.Position.Position = (pcVar1->CurrentSnapshot).Position.Position;
  snapshot.State = (pcVar1->CurrentSnapshot).State;
  snapshot.Position.Tree = (pcVar1->CurrentSnapshot).Position.Tree;
  cmState::Snapshot::GetDirectory((Directory *)&msg,&snapshot);
  pcVar4 = cmake::GetHomeDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)num,pcVar4,(allocator *)&globalTargets);
  cmState::Directory::SetCurrentSource((Directory *)&msg,(string *)num);
  std::__cxx11::string::~string((string *)num);
  cmState::Snapshot::GetDirectory((Directory *)&msg,&snapshot);
  pcVar4 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)num,pcVar4,(allocator *)&globalTargets);
  cmState::Directory::SetCurrentBinary((Directory *)&msg,(string *)num);
  std::__cxx11::string::~string((string *)num);
  pcVar5 = (cmMakefile *)operator_new(0x730);
  cmMakefile::cmMakefile(pcVar5,this,&snapshot);
  dirMf = pcVar5;
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back(&this->Makefiles,&dirMf);
  pcVar4 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)&msg,pcVar4,(allocator *)num);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->BinaryDirectories,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  cmMakefile::Configure(dirMf);
  cmMakefile::EnforceDirectoryLevelRules(dirMf);
  this->ConfigureDoneCMP0026AndCMP0024 = true;
  globalTargets._M_h._M_buckets = &globalTargets._M_h._M_single_bucket;
  globalTargets._M_h._M_bucket_count = 1;
  globalTargets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  globalTargets._M_h._M_element_count = 0;
  globalTargets._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  globalTargets._M_h._M_rehash_policy._M_next_resize = 0;
  globalTargets._M_h._M_single_bucket = (__node_base_ptr)0x0;
  CreateDefaultGlobalTargets(this,&globalTargets);
  uVar8 = 0;
  while( true ) {
    ppcVar2 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->Makefiles).
                      super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppcVar2 >> 3) <= (ulong)uVar8)
    break;
    pcVar5 = ppcVar2[uVar8];
    this_00 = &pcVar5->Targets;
    p_Var9 = &globalTargets._M_h._M_before_begin;
    while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
      pmVar6 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,(key_type *)(p_Var9 + 1));
      cmTarget::operator=(pmVar6,(cmTarget *)(p_Var9 + 5));
      pmVar6 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,(key_type *)(p_Var9 + 1));
      cmTarget::SetMakefile(pmVar6,pcVar5);
    }
    uVar8 = uVar8 + 1;
  }
  sprintf(num,"%d");
  pcVar1 = this->CMakeInstance;
  std::__cxx11::string::string((string *)&msg,"CMAKE_NUMBER_OF_MAKEFILES",(allocator *)&f);
  cmake::AddCacheEntry(pcVar1,(string *)&msg,num,"number of local generators",4);
  std::__cxx11::string::~string((string *)&msg);
  CheckTargetProperties(this);
  if (this->CMakeInstance->CurrentWorkingMode == NORMAL_MODE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    bVar3 = cmSystemTools::GetErrorOccuredFlag();
    if (bVar3) {
      std::operator<<((ostream *)&msg,"Configuring incomplete, errors occurred!");
      for (ppuVar10 = &PTR_anon_var_dwarf_d4a76_0059b640; *ppuVar10 != (undefined *)0x0;
          ppuVar10 = ppuVar10 + 1) {
        pcVar4 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
        std::__cxx11::string::string((string *)&f,pcVar4,&local_291);
        std::__cxx11::string::append((char *)&f);
        std::__cxx11::string::append((char *)&f);
        std::__cxx11::string::append((char *)&f);
        bVar3 = cmsys::SystemTools::FileExists(f._M_dataplus._M_p);
        if (bVar3) {
          poVar7 = std::operator<<((ostream *)&msg,"\nSee also \"");
          poVar7 = std::operator<<(poVar7,(string *)&f);
          std::operator<<(poVar7,"\".");
        }
        std::__cxx11::string::~string((string *)&f);
      }
    }
    else {
      std::operator<<((ostream *)&msg,"Configuring done");
    }
    pcVar1 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmake::UpdateProgress(pcVar1,f._M_dataplus._M_p,-1.0);
    std::__cxx11::string::~string((string *)&f);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&globalTargets._M_h);
  return;
}

Assistant:

void cmGlobalGenerator::Configure()
{
  this->FirstTimeProgress = 0.0f;
  this->ClearGeneratorMembers();

  cmState::Snapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();

  snapshot.GetDirectory().SetCurrentSource
    (this->CMakeInstance->GetHomeDirectory());
  snapshot.GetDirectory().SetCurrentBinary
    (this->CMakeInstance->GetHomeOutputDirectory());

  cmMakefile* dirMf = new cmMakefile(this, snapshot);
  this->Makefiles.push_back(dirMf);

  this->BinaryDirectories.insert(
      this->CMakeInstance->GetHomeOutputDirectory());

  // now do it
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  dirMf->Configure();
  dirMf->EnforceDirectoryLevelRules();

  this->ConfigureDoneCMP0026AndCMP0024 = true;

  // Put a copy of each global target in every directory.
  cmTargets globalTargets;
  this->CreateDefaultGlobalTargets(&globalTargets);

  for (unsigned int i = 0; i < this->Makefiles.size(); ++i)
    {
    cmMakefile* mf = this->Makefiles[i];
    cmTargets* targets = &(mf->GetTargets());
    cmTargets::iterator tit;
    for ( tit = globalTargets.begin(); tit != globalTargets.end(); ++ tit )
      {
      (*targets)[tit->first] = tit->second;
      (*targets)[tit->first].SetMakefile(mf);
      }
    }

  // update the cache entry for the number of local generators, this is used
  // for progress
  char num[100];
  sprintf(num,"%d",static_cast<int>(this->Makefiles.size()));
  this->GetCMakeInstance()->AddCacheEntry
    ("CMAKE_NUMBER_OF_MAKEFILES", num,
     "number of local generators", cmState::INTERNAL);

  // check for link libraries and include directories containing "NOTFOUND"
  // and for infinite loops
  this->CheckTargetProperties();

  if ( this->CMakeInstance->GetWorkingMode() == cmake::NORMAL_MODE)
    {
    std::ostringstream msg;
    if(cmSystemTools::GetErrorOccuredFlag())
      {
      msg << "Configuring incomplete, errors occurred!";
      const char* logs[] = {"CMakeOutput.log", "CMakeError.log", 0};
      for(const char** log = logs; *log; ++log)
        {
        std::string f = this->CMakeInstance->GetHomeOutputDirectory();
        f += this->CMakeInstance->GetCMakeFilesDirectory();
        f += "/";
        f += *log;
        if(cmSystemTools::FileExists(f.c_str()))
          {
          msg << "\nSee also \"" << f << "\".";
          }
        }
      }
    else
      {
      msg << "Configuring done";
      }
    this->CMakeInstance->UpdateProgress(msg.str().c_str(), -1);
    }
}